

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O3

EStatusCode __thiscall
UnicodeString::FromUTF16UShort(UnicodeString *this,unsigned_short *inShorts,unsigned_long inLength)

{
  size_t *psVar1;
  ushort uVar2;
  _List_node_base *p_Var3;
  Trace *this_00;
  _List_node_base *p_Var4;
  ulong uVar5;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  if (inLength != 0) {
    uVar5 = 0;
    do {
      uVar2 = inShorts[uVar5];
      p_Var4 = (_List_node_base *)(ulong)uVar2;
      if ((uVar2 & 0xfc00) == 0xd800) {
        if ((inLength <= uVar5 + 1) || ((ushort)(inShorts[uVar5 + 1] + 0x2000) < 0xfc00)) {
          this_00 = Trace::DefaultTrace();
          Trace::TraceToLog(this_00,
                            "UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate"
                           );
          return eFailure;
        }
        p_Var4 = (_List_node_base *)
                 (ulong)((uint)uVar2 * 0x400 + (uint)inShorts[uVar5 + 1] + 0x202400 & 0x3fffff);
        uVar5 = uVar5 + 1;
      }
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->mUnicodeCharacters).
                super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < inLength);
  }
  return eSuccess;
}

Assistant:

EStatusCode UnicodeString::FromUTF16UShort(const unsigned short* inShorts, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	for(unsigned long i = 0; i < inLength && PDFHummus::eSuccess == status; ++i)
	{
		if(0xD800 <= inShorts[i] && inShorts[i] <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			++i;
			if(i>=inLength)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			if(0xDC00 > inShorts[i] || inShorts[i] > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			mUnicodeCharacters.push_back(0x10000 + ((inShorts[i-1] - 0xD800) << 10) + (inShorts[i] - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(inShorts[i]);		
	}

	return status;		
}